

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestProgramEnd(StreamingListener *this,UnitTest *unit_test)

{
  pointer pAVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_stack_ffffffffffffff88;
  string *__lhs;
  string local_50 [23];
  undefined1 in_stack_ffffffffffffffc7;
  StreamingListener *in_stack_ffffffffffffffc8;
  string local_30 [48];
  
  UnitTest::Passed((UnitTest *)0x5b0292);
  __lhs = local_50;
  FormatBool_abi_cxx11_(in_stack_ffffffffffffffc8,(bool)in_stack_ffffffffffffffc7);
  std::operator+((char *)__lhs,in_RDI);
  SendLn((StreamingListener *)in_RDI,in_stack_ffffffffffffff88);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  pAVar1 = std::
           unique_ptr<testing::internal::StreamingListener::AbstractSocketWriter,_std::default_delete<testing::internal::StreamingListener::AbstractSocketWriter>_>
           ::operator->((unique_ptr<testing::internal::StreamingListener::AbstractSocketWriter,_std::default_delete<testing::internal::StreamingListener::AbstractSocketWriter>_>
                         *)0x5b02f4);
  (*pAVar1->_vptr_AbstractSocketWriter[3])();
  return;
}

Assistant:

void OnTestProgramEnd(const UnitTest& unit_test) override {
    // Note that Google Test current only report elapsed time for each
    // test iteration, not for the entire test program.
    SendLn("event=TestProgramEnd&passed=" + FormatBool(unit_test.Passed()));

    // Notify the streaming server to stop.
    socket_writer_->CloseConnection();
  }